

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void reduce_min_max(uint8_t *v1,uint8_t *v2)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = *v1;
  bVar2 = *v2;
  if (-1 < (char)(bVar2 ^ bVar1)) {
    if ((char)bVar1 < '\0') {
      if (bVar2 < bVar1) {
        bVar2 = bVar1;
      }
    }
    else if (bVar1 != 0x7f) {
      if (bVar2 == 0x7f) {
        return;
      }
      if (bVar1 < bVar2) {
        bVar2 = bVar1;
      }
    }
    *v1 = bVar2;
  }
  return;
}

Assistant:

void reduce_min_max(uint8_t &v1, const uint8_t &v2)
{
  bool parent_or_depth;
  if (v1 & indicator_bit)
    parent_or_depth = true;
  else
    parent_or_depth = false;
  bool p_or_d2;
  if (v2 & indicator_bit)
    p_or_d2 = true;
  else
    p_or_d2 = false;
  if (parent_or_depth != p_or_d2)
  {
#ifdef DEBUG
    cout << "Reducing parent with depth!!!!!";
#endif  // DEBUG
    return;
  }

  if (parent_or_depth)
    v1 = (v1 >= v2) ? v1 : v2;
  else
  {
    if (v1 == default_depth)
      v1 = v2;
    else if (v2 != default_depth)
      v1 = (v1 <= v2) ? v1 : v2;
  }
}